

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::connectEstablished(TcpConnection *this)

{
  bool bVar1;
  pointer pCVar2;
  enable_shared_from_this<sznet::net::TcpConnection> local_50 [2];
  enable_shared_from_this<sznet::net::TcpConnection> local_30;
  shared_ptr<void> local_20;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  local_10 = this;
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state != kConnecting) {
    __assert_fail("m_state == kConnecting",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                  ,0x128,"void sznet::net::TcpConnection::connectEstablished()");
  }
  setState(this,kConnected);
  pCVar2 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this(&local_30);
  std::shared_ptr<void>::shared_ptr<sznet::net::TcpConnection,void>
            (&local_20,(shared_ptr<sznet::net::TcpConnection> *)&local_30);
  Channel::tie(pCVar2,&local_20);
  std::shared_ptr<void>::~shared_ptr(&local_20);
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)&local_30);
  pCVar2 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  Channel::enableReading(pCVar2);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->m_connectionCallback);
  if (bVar1) {
    std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this(local_50);
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator()
              (&this->m_connectionCallback,(shared_ptr<sznet::net::TcpConnection> *)local_50);
    std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::TcpConnection> *)local_50);
  }
  return;
}

Assistant:

void TcpConnection::connectEstablished()
{
	m_loop->assertInLoopThread();
	assert(m_state == kConnecting);
	setState(kConnected);
	m_channel->tie(shared_from_this());
	m_channel->enableReading();

	if (m_connectionCallback)
	{
		m_connectionCallback(shared_from_this());
	}
}